

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-syntax.cc
# Opt level: O0

int parse_command_line(int argc,char **argv)

{
  int iVar1;
  runtime_error *prVar2;
  invalid_argument *this;
  int local_1c;
  int c;
  int long_option_index;
  char **argv_local;
  int argc_local;
  
  _c = argv;
  argv_local._4_4_ = argc;
  while( true ) {
    local_1c = -1;
    iVar1 = getopt_long(argv_local._4_4_,_c,"cd:hn:o:ptj",long_options,&local_1c);
    if (iVar1 == -1) {
      return _optind;
    }
    if (iVar1 == 0x3a) break;
    if (iVar1 == 0x3f) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Unknown command-line option");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (iVar1 == 0) {
      iVar1 = strcmp(long_options[local_1c].name,"asynchronous-events");
      if (iVar1 != 0) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"This also should never be executed");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      report_asynchronous_events = true;
    }
    else {
      switch(iVar1) {
      case 99:
        check_syntax = true;
        break;
      case 100:
        std::__cxx11::string::operator=((string *)&delimiter_abi_cxx11_,_optarg);
        break;
      default:
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"This should never be executed");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      case 0x68:
        help = true;
        break;
      case 0x6a:
        json = true;
        break;
      case 0x6e:
        std::__cxx11::string::operator=((string *)&process_name_abi_cxx11_,_optarg);
        break;
      case 0x6f:
        iVar1 = strcmp(_optarg,"");
        if (iVar1 == 0) {
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this,"Invalid empty output file name");
          __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                     );
        }
        std::__cxx11::string::operator=((string *)&output_file_abi_cxx11_,_optarg);
        break;
      case 0x70:
        synchronized_product = true;
        break;
      case 0x74:
        transform = true;
      }
    }
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"Missing option parameter");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int parse_command_line(int argc, char * argv[])
{
  while (true) {
    int long_option_index = -1;
    int c = getopt_long(argc, argv, options, long_options, &long_option_index);

    if (c == -1)
      break;

    if (c == ':')
      throw std::runtime_error("Missing option parameter");
    else if (c == '?')
      throw std::runtime_error("Unknown command-line option");
    else if (c != 0) {
      switch (c) {
      case 'c':
        check_syntax = true;
        break;
      case 'd':
        delimiter = optarg;
        break;
      case 'h':
        help = true;
        break;
      case 'n':
        process_name = optarg;
        break;
      case 'o':
        if (strcmp(optarg, "") == 0)
          throw std::invalid_argument("Invalid empty output file name");
        output_file = optarg;
        break;
      case 'p':
        synchronized_product = true;
        break;
      case 't':
        transform = true;
        break;
      case 'j':
        json = true;
        break;
      default:
        throw std::runtime_error("This should never be executed");
        break;
      }
    }
    else {
      if (strcmp(long_options[long_option_index].name, "asynchronous-events") == 0)
        report_asynchronous_events = true;
      else
        throw std::runtime_error("This also should never be executed");
    }
  }

  return optind;
}